

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

fct_ts_t * fct_ts_new(char *name)

{
  fct_ts_t *pfVar1;
  void **ppvVar2;
  
  pfVar1 = (fct_ts_t *)calloc(1,0x128);
  if (pfVar1 != (fct_ts_t *)0x0) {
    fctstr_safe_cpy(pfVar1->name,name,0x100);
    pfVar1->mode = ts_mode_cnt;
    ppvVar2 = (void **)malloc(0x40);
    (pfVar1->test_list).itm_list = ppvVar2;
    if (ppvVar2 != (void **)0x0) {
      (pfVar1->test_list).avail_itm_num = 8;
      (pfVar1->test_list).used_itm_num = 0;
    }
    return pfVar1;
  }
  __assert_fail("ts != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x483,
                "fct_ts_t *fct_ts_new(const char *)");
}

Assistant:

static fct_ts_t *
fct_ts_new(char const *name)
{
    fct_ts_t *ts =NULL;
    ts = (fct_ts_t*)calloc(1, sizeof(fct_ts_t));
    FCT_ASSERT( ts != NULL );

    fctstr_safe_cpy(ts->name, name, FCT_MAX_NAME);
    ts->mode = ts_mode_cnt;
    fct_nlist__init(&(ts->test_list));
    return ts;
}